

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushButtonRepeat(bool repeat)

{
  ImGuiWindow *pIVar1;
  bool in_DIL;
  value_type_conflict1 local_1;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  (pIVar1->DC).ButtonRepeat = in_DIL;
  ImVector<bool>::push_back(&(pIVar1->DC).ButtonRepeatStack,&local_1);
  return;
}

Assistant:

void ImGui::PushButtonRepeat(bool repeat)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.ButtonRepeat = repeat;
    window->DC.ButtonRepeatStack.push_back(repeat);
}